

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  unsigned_long uVar2;
  uint uVar3;
  FieldEntry *pFVar4;
  char *pcVar5;
  RepeatedField<unsigned_long> *this;
  pointer puVar6;
  string *psVar7;
  RepeatedField<unsigned_int> *this_00;
  pointer puVar8;
  ulong uVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  unsigned_long *p;
  uint32_t *ptr_00;
  uint uVar12;
  uint32_t next_tag;
  unsigned_short local_42;
  uint local_40 [4];
  
  pFVar4 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  uVar3 = data.field_0._0_4_;
  uVar12 = uVar3 & 7;
  if (uVar12 == 2) {
    pcVar5 = MpPackedFixed<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  aVar11._0_4_ = pFVar4->type_card & 0x1c0;
  aVar11.data._4_4_ = 0;
  if ((short)aVar11._0_4_ == 0xc0) {
    if (uVar12 != 1) {
LAB_00152e10:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_00152e22;
    }
    this = RefAt<google::protobuf::RepeatedField<unsigned_long>>(msg,(ulong)pFVar4->offset);
    do {
      uVar2 = *(unsigned_long *)ptr;
      puVar6 = RepeatedField<unsigned_long>::Add(this);
      *puVar6 = uVar2;
      p = (unsigned_long *)((long)ptr + 8);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00152e5c;
      ptr_00 = local_40;
      ptr = ReadTag((char *)p,local_40,0);
      ctx_00 = extraout_RDX;
      if ((unsigned_long *)ptr == (unsigned_long *)0x0) {
LAB_00152e75:
        pcVar5 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)aVar11,table,hasbits);
        return pcVar5;
      }
    } while (local_40[0] == uVar3);
  }
  else {
    local_40[0] = CONCAT22(local_40[0]._2_2_,(short)aVar11._0_4_);
    local_42 = 0x80;
    psVar7 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                       ((unsigned_short *)local_40,&local_42,
                        "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (psVar7 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6fb,psVar7->_M_string_length,(psVar7->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    if (uVar12 != 5) goto LAB_00152e10;
    this_00 = RefAt<google::protobuf::RepeatedField<unsigned_int>>(msg,(ulong)pFVar4->offset);
    do {
      uVar12 = *(uint *)ptr;
      puVar8 = RepeatedField<unsigned_int>::Add(this_00);
      *puVar8 = uVar12;
      p = (unsigned_long *)((long)ptr + 4);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00152e5c;
      ptr_00 = local_40;
      ptr = ReadTag((char *)p,local_40,0);
      ctx_00 = extraout_RDX_00;
      if ((uint *)ptr == (uint *)0x0) goto LAB_00152e75;
    } while (local_40[0] == uVar3);
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
    uVar1 = table->has_bits_offset;
joined_r0x00152e71:
    if (uVar1 != 0) {
      puVar10 = RefAt<unsigned_int>(msg,(ulong)uVar1);
      *puVar10 = *puVar10 | (uint)hasbits;
    }
    return (char *)p;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)(ushort)*p;
  if ((uVar3 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar9 = (ulong)(uVar3 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)(ushort)*p ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
  ptr = (char *)p;
LAB_00152e22:
  pcVar5 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar5;
LAB_00152e5c:
  uVar1 = table->has_bits_offset;
  goto joined_r0x00152e71;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}